

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O2

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:926:25)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  strand *psVar1;
  strand_service *this;
  bool bVar2;
  uchar *puVar3;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
  *op;
  long in_FS_OFFSET;
  type local_a0;
  on_dispatch_exit on_exit;
  ptr local_78;
  ptr local_60;
  context ctx;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25),_std::error_code>
  handler;
  
  local_60.h = &handler.handler_;
  handler.handler_.this = *(Connection **)&base[1].task_result_;
  handler.arg1_._0_8_ = base[1].next_;
  handler.arg1_._M_cat = (error_category *)base[1].func_;
  local_60.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
                *)base;
  local_60.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:926:25)>
                *)base;
  ptr::reset(&local_60);
  if (owner != (void *)0x0) {
    psVar1 = ((handler.handler_.this)->AsioEventStrand)._M_t.
             super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
             .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl;
    local_a0.error._M_value = handler.arg1_._M_value;
    local_a0.error._4_4_ = handler.arg1_._4_4_;
    local_a0.error._M_cat = handler.arg1_._M_cat;
    local_a0.this = handler.handler_.this;
    this = psVar1->service_;
    puVar3 = call_stack<asio::detail::strand_service::strand_impl,_unsigned_char>::contains
                       (psVar1->impl_);
    if (puVar3 == (uchar *)0x0) {
      local_78.h = &local_a0;
      op = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
            *)asio_handler_allocate(0x30);
      (op->super_operation).next_ = (scheduler_operation *)0x0;
      (op->super_operation).func_ =
           completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:930:35)>
           ::do_complete;
      (op->super_operation).task_result_ = 0;
      (op->handler_).this = local_a0.this;
      (op->handler_).error._M_value = local_a0.error._M_value;
      *(undefined4 *)&(op->handler_).error.field_0x4 = local_a0.error._4_4_;
      (op->handler_).error._M_cat = local_a0.error._M_cat;
      local_78.v = op;
      local_78.p = op;
      bVar2 = strand_service::do_dispatch(this,&psVar1->impl_,(operation *)op);
      local_78.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
                    *)0x0;
      local_78.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:930:35)>
                    *)0x0;
      if (bVar2) {
        on_exit.impl_ = psVar1->impl_;
        ctx.next_ = *(context **)(in_FS_OFFSET + -8);
        ctx.value_ = (uchar *)&ctx;
        *(uchar **)(in_FS_OFFSET + -8) = ctx.value_;
        on_exit.io_context_ = this->io_context_;
        ctx.key_ = on_exit.impl_;
        completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:930:35)>
        ::do_complete(on_exit.io_context_,(operation *)op,(error_code *)ctx.next_,(size_t)ctx.value_
                     );
        strand_service::on_dispatch_exit::~on_dispatch_exit(&on_exit);
        *(context **)(in_FS_OFFSET + -8) = ctx.next_;
      }
      completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:930:35)>
      ::ptr::~ptr(&local_78);
    }
    else {
      asio_handler_invoke_helpers::operator()(&local_a0,(type *)base);
    }
  }
  ptr::~ptr(&local_60);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }